

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::tuple_caster<std::pair,_kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
load(tuple_caster<std::pair,_kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *this,handle src,
    bool convert)

{
  bool bVar1;
  size_t sVar2;
  sequence local_38;
  sequence seq;
  bool convert_local;
  tuple_caster<std::pair,_kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *this_local;
  handle src_local;
  
  seq.super_object.super_handle.m_ptr = (object)(object)src.m_ptr;
  bVar1 = isinstance<pybind11::sequence,_0>(src);
  if (bVar1) {
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_38,src);
    sVar2 = sequence::size(&local_38);
    if (sVar2 == 2) {
      src_local.m_ptr._7_1_ =
           tuple_caster<std::pair,kratos::EventEdgeType,std::shared_ptr<kratos::Var>>::
           load_impl<0ul,1ul>((tuple_caster<std::pair,kratos::EventEdgeType,std::shared_ptr<kratos::Var>>
                               *)this,&local_38,convert);
    }
    else {
      src_local.m_ptr._7_1_ = false;
    }
    sequence::~sequence(&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        const auto seq = reinterpret_borrow<sequence>(src);
        if (seq.size() != size)
            return false;
        return load_impl(seq, convert, indices{});
    }